

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

void absl::lts_20250127::anon_unknown_1::AppendNumberUnit(string *out,double n,DisplayUnit unit)

{
  int *piVar1;
  long v;
  char *pcVar2;
  const_pointer pvVar3;
  double dVar4;
  char *bp;
  int64_t int_part;
  int64_t frac_part;
  double d;
  char *ep;
  char buf [15];
  int prec;
  int kBufferSize;
  double n_local;
  string *out_local;
  
  buf[0xb] = '\x0f';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  piVar1 = std::min<int>((int *)(buf + 0xb),&unit.prec);
  buf._7_4_ = *piVar1;
  d = (double)(buf + 7);
  frac_part = 0;
  dVar4 = modf(n,(double *)&frac_part);
  dVar4 = round(dVar4 * unit.pow10);
  v = (long)dVar4;
  if (((long)(double)frac_part != 0) || (v != 0)) {
    pcVar2 = Format64((char *)d,0,(long)(double)frac_part);
    std::__cxx11::string::append((char *)out,(ulong)pcVar2);
    if (v != 0) {
      std::__cxx11::string::push_back((char)out);
      pcVar2 = Format64((char *)d,buf._7_4_,v);
      for (; *(char *)((long)d + -1) == '0'; d = (double)((long)d + -1)) {
      }
      std::__cxx11::string::append((char *)out,(ulong)pcVar2);
    }
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data(&unit.abbr);
    std::basic_string_view<char,_std::char_traits<char>_>::size(&unit.abbr);
    std::__cxx11::string::append((char *)out,(ulong)pvVar3);
  }
  return;
}

Assistant:

void AppendNumberUnit(std::string* out, double n, DisplayUnit unit) {
  constexpr int kBufferSize = std::numeric_limits<double>::digits10;
  const int prec = std::min(kBufferSize, unit.prec);
  char buf[kBufferSize];  // also large enough to hold integer part
  char* ep = buf + sizeof(buf);
  double d = 0;
  int64_t frac_part = std::round(std::modf(n, &d) * unit.pow10);
  int64_t int_part = d;
  if (int_part != 0 || frac_part != 0) {
    char* bp = Format64(ep, 0, int_part);  // always < 1000
    out->append(bp, static_cast<size_t>(ep - bp));
    if (frac_part != 0) {
      out->push_back('.');
      bp = Format64(ep, prec, frac_part);
      while (ep[-1] == '0') --ep;
      out->append(bp, static_cast<size_t>(ep - bp));
    }
    out->append(unit.abbr.data(), unit.abbr.size());
  }
}